

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::BitfieldInsertCaseInstance::getInputValues
          (BitfieldInsertCaseInstance *this,int numValues,void **values)

{
  ShaderType shaderType;
  DataType dataType;
  int max;
  pointer pSVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  deUint32 dVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int in_R9D;
  ulong uVar10;
  Random rnd;
  deRandom local_40;
  
  dVar6 = deStringHash((this->super_IntegerFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar6 ^ 0x12c2acff);
  pSVar1 = (this->super_IntegerFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  shaderType = (pSVar1->varType).m_data.basic.type;
  dataType = *(DataType *)((long)&(pSVar1->varType).m_data + 4);
  max = *(int *)(&DAT_009f53e8 + (ulong)dataType * 4);
  pvVar2 = *values;
  pvVar3 = values[1];
  pvVar4 = values[2];
  pvVar5 = values[3];
  uVar9 = 0;
  uVar10 = 0;
  if (0 < numValues) {
    uVar10 = (ulong)(uint)numValues;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    iVar7 = de::Random::getInt((Random *)&local_40,0,max);
    iVar8 = de::Random::getInt((Random *)&local_40,0,max - iVar7);
    *(int *)((long)pvVar4 + uVar9 * 4) = iVar8;
    *(int *)((long)pvVar5 + uVar9 * 4) = iVar7;
  }
  shaderexecutor::anon_unknown_0::generateRandomInputData
            ((Random *)&local_40,shaderType,dataType,(Precision)pvVar2,
             (deUint32 *)(ulong)(uint)numValues,in_R9D);
  shaderexecutor::anon_unknown_0::generateRandomInputData
            ((Random *)&local_40,shaderType,dataType,(Precision)pvVar3,
             (deUint32 *)(ulong)(uint)numValues,in_R9D);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(m_name) ^ 0x12c2acff);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				numBits		= getShaderUintBitCount(m_shaderType, precision);
		deUint32*				inBase		= (deUint32*)values[0];
		deUint32*				inInsert	= (deUint32*)values[1];
		int*					inOffset	= (int*)values[2];
		int*					inBits		= (int*)values[3];

		for (int valueNdx = 0; valueNdx < numValues; ++valueNdx)
		{
			const int bits		= rnd.getInt(0, numBits);
			const int offset	= rnd.getInt(0, numBits-bits);

			inOffset[valueNdx]	= offset;
			inBits[valueNdx]	= bits;
		}

		generateRandomInputData(rnd, m_shaderType, type, precision, inBase, numValues);
		generateRandomInputData(rnd, m_shaderType, type, precision, inInsert, numValues);
	}